

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O0

void __thiscall
estl::state_machine<cdplayer>::execute_actions
          (state_machine<cdplayer> *this,state_type state,inputs_type *inputs,outputs_type *outputs)

{
  bool bVar1;
  state_not_found *this_00;
  undefined1 local_48 [8];
  actions_fun fn;
  outputs_type *outputs_local;
  inputs_type *inputs_local;
  state_type state_local;
  state_machine<cdplayer> *this_local;
  
  fn._M_invoker = (_Invoker_type)outputs;
  get_action_function((actions_fun *)local_48,this,state);
  bVar1 = std::function::operator_cast_to_bool((function *)local_48);
  if (!bVar1) {
    this_00 = (state_not_found *)__cxa_allocate_exception(8);
    *this_00 = (state_not_found)0x0;
    state_not_found::state_not_found(this_00);
    __cxa_throw(this_00,&state_not_found::typeinfo,state_not_found::~state_not_found);
  }
  std::function<void_(const_cdplayer::inputs_type_&,_cdplayer::outputs_type_&)>::operator()
            ((function<void_(const_cdplayer::inputs_type_&,_cdplayer::outputs_type_&)> *)local_48,
             inputs,(outputs_type *)fn._M_invoker);
  std::function<void_(const_cdplayer::inputs_type_&,_cdplayer::outputs_type_&)>::~function
            ((function<void_(const_cdplayer::inputs_type_&,_cdplayer::outputs_type_&)> *)local_48);
  return;
}

Assistant:

void execute_actions(state_type state, const inputs_type& inputs, outputs_type& outputs) const {
        const auto fn = get_action_function(state);
        if (!fn) {
            throw state_not_found{};
        }
        fn(inputs, outputs);
    }